

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_interpolate_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_INTERP ref_interp;
  REF_MPI pRVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  REF_DBL *pRVar7;
  REF_DBL *pRVar8;
  char *pcVar9;
  long lVar10;
  REF_DBL log_m [6];
  REF_DBL bary [4];
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  REF_DBL local_1b8 [6];
  REF_DBL local_188 [4];
  REF_INT local_168 [28];
  REF_DBL local_f8 [25];
  
  ref_interp = ref_grid->interp;
  if (ref_interp != (REF_INTERP)0x0) {
    pRVar1 = ref_grid->mpi;
    ref_node = ref_interp->from_grid->node;
    ref_cell = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
    if ((ref_interp->max <= new_node) &&
       (uVar2 = ref_interp_resize(ref_interp,ref_interp->to_grid->node->max), uVar2 != 0)) {
      uVar5 = (ulong)uVar2;
      pcVar9 = "resize";
      uVar6 = 0x224;
LAB_001b90f3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar6,"ref_metric_interpolate_between",uVar5,pcVar9);
      return (REF_STATUS)uVar5;
    }
    if (ref_interp->continuously == 0) {
      ref_interp->cell[new_node] = -1;
    }
    else {
      RVar3 = ref_interp_locate_between(ref_interp,node0,node1,new_node);
      if (RVar3 != 0) {
        return RVar3;
      }
      if (ref_interp->cell[new_node] != -1) {
        if (pRVar1->id != ref_interp->part[new_node]) {
          return 0;
        }
        uVar2 = ref_cell_nodes(ref_cell,ref_interp->cell[new_node],local_168);
        if (uVar2 == 0) {
          uVar2 = ref_node_clip_bary4(ref_interp->bary + new_node * 4,local_188);
          if (uVar2 == 0) {
            pRVar7 = local_f8;
            lVar10 = 0;
            do {
              uVar2 = ref_cell->node_per;
              if ((int)uVar2 <= lVar10) {
                for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                  local_1b8[lVar10] = 0.0;
                }
                uVar4 = 0;
                uVar5 = (ulong)uVar2;
                if ((int)uVar2 < 1) {
                  uVar5 = uVar4;
                }
                pRVar7 = local_f8;
                for (; uVar4 != 6; uVar4 = uVar4 + 1) {
                  pRVar8 = local_188;
                  for (lVar10 = 0; uVar5 * 6 - lVar10 != 0; lVar10 = lVar10 + 6) {
                    local_1b8[uVar4] = *pRVar8 * pRVar7[lVar10] + local_1b8[uVar4];
                    pRVar8 = pRVar8 + 1;
                  }
                  pRVar7 = pRVar7 + 1;
                }
                uVar2 = ref_node_metric_set_log(ref_grid->node,new_node,local_1b8);
                if (uVar2 == 0) {
                  return 0;
                }
                uVar5 = (ulong)uVar2;
                pcVar9 = "set interp log met";
                uVar6 = 0x242;
                goto LAB_001b90f3;
              }
              uVar2 = ref_node_metric_get_log(ref_node,local_168[lVar10],pRVar7);
              lVar10 = lVar10 + 1;
              pRVar7 = pRVar7 + 6;
            } while (uVar2 == 0);
            uVar5 = (ulong)uVar2;
            pcVar9 = "log(parentM)";
            uVar6 = 0x23a;
          }
          else {
            uVar5 = (ulong)uVar2;
            pcVar9 = "clip";
            uVar6 = 0x236;
          }
        }
        else {
          uVar5 = (ulong)uVar2;
          pcVar9 = "new_node needs to be localized";
          uVar6 = 0x234;
        }
        goto LAB_001b90f3;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate_between(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_INT new_node) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_NODE to_node;
  REF_DBL log_parent_m[4][6], log_m[6], bary[4];
  REF_INT ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* skip null interp */
  if (NULL == ref_grid_interp(ref_grid)) return REF_SUCCESS;
  ref_interp = ref_grid_interp(ref_grid);
  from_grid = ref_interp_from_grid(ref_interp);
  from_node = ref_grid_node(from_grid);
  from_node = ref_grid_node(from_grid);
  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }
  to_node = ref_grid_node(ref_interp_to_grid(ref_interp));

  if (new_node >= ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  if (!ref_interp_continuously(ref_interp)) {
    ref_interp->cell[new_node] = REF_EMPTY; /* initialize new_node locate */
    return REF_SUCCESS;
  }

  RAISE(ref_interp_locate_between(ref_interp, node0, node1, new_node));

  /* location unsuccessful or off-part don't interpolate */
  if (REF_EMPTY == ref_interp_cell(ref_interp, new_node) ||
      ref_mpi_rank(ref_mpi) != ref_interp_part(ref_interp, new_node))
    return REF_SUCCESS;

  RSS(ref_cell_nodes(from_cell, ref_interp_cell(ref_interp, new_node), nodes),
      "new_node needs to be localized");
  RSS(ref_node_clip_bary4(&ref_interp_bary(ref_interp, 0, new_node), bary),
      "clip");

  for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++)
    RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
        "log(parentM)");
  for (im = 0; im < 6; im++) log_m[im] = 0.0;
  for (im = 0; im < 6; im++) {
    for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
      log_m[im] += bary[ibary] * log_parent_m[ibary][im];
    }
  }
  RSS(ref_node_metric_set_log(ref_grid_node(ref_grid), new_node, log_m),
      "set interp log met");

  return REF_SUCCESS;
}